

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls_scache.c
# Opt level: O2

CURLcode Curl_ssl_session_create2
                   (void *sdata,size_t sdata_len,int ietf_tls_id,char *alpn,curl_off_t valid_until,
                   size_t earlydata_max,uchar *quic_tp,size_t quic_tp_len,
                   Curl_ssl_session **psession)

{
  CURLcode CVar1;
  Curl_ssl_session *obj;
  char *pcVar2;
  
  if (sdata == (void *)0x0 || sdata_len == 0) {
    (*Curl_cfree)(sdata);
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  *psession = (Curl_ssl_session *)0x0;
  obj = (Curl_ssl_session *)(*Curl_ccalloc)(1,0x60);
  if (obj == (Curl_ssl_session *)0x0) {
    (*Curl_cfree)(sdata);
    (*Curl_cfree)(quic_tp);
LAB_0016dc0d:
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else {
    obj->ietf_tls_id = ietf_tls_id;
    obj->valid_until = valid_until;
    obj->earlydata_max = earlydata_max;
    obj->sdata = sdata;
    obj->sdata_len = sdata_len;
    obj->quic_tp = quic_tp;
    obj->quic_tp_len = quic_tp_len;
    if (alpn != (char *)0x0) {
      pcVar2 = (*Curl_cstrdup)(alpn);
      obj->alpn = pcVar2;
      if (pcVar2 == (char *)0x0) {
        cf_ssl_scache_sesssion_ldestroy(alpn,obj);
        goto LAB_0016dc0d;
      }
    }
    *psession = obj;
    CVar1 = CURLE_OK;
  }
  return CVar1;
}

Assistant:

CURLcode
Curl_ssl_session_create2(void *sdata, size_t sdata_len,
                         int ietf_tls_id, const char *alpn,
                         curl_off_t valid_until, size_t earlydata_max,
                         unsigned char *quic_tp, size_t quic_tp_len,
                         struct Curl_ssl_session **psession)
{
  struct Curl_ssl_session *s;

  if(!sdata || !sdata_len) {
    free(sdata);
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }

  *psession = NULL;
  s = calloc(1, sizeof(*s));
  if(!s) {
    free(sdata);
    free(quic_tp);
    return CURLE_OUT_OF_MEMORY;
  }

  s->ietf_tls_id = ietf_tls_id;
  s->valid_until = valid_until;
  s->earlydata_max = earlydata_max;
  s->sdata = sdata;
  s->sdata_len = sdata_len;
  s->quic_tp = quic_tp;
  s->quic_tp_len = quic_tp_len;
  if(alpn) {
    s->alpn = strdup(alpn);
    if(!s->alpn) {
      cf_ssl_scache_sesssion_ldestroy(NULL, s);
      return CURLE_OUT_OF_MEMORY;
    }
  }
  *psession = s;
  return CURLE_OK;
}